

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool __thiscall VmBlock::HasExternalInstructionUsers(VmBlock *this)

{
  VmValue *pVVar1;
  VmInstruction *pVVar2;
  ulong uVar3;
  ulong uVar4;
  
  pVVar2 = this->firstInstruction;
  do {
    if (pVVar2 == (VmInstruction *)0x0) {
      return false;
    }
    uVar3 = (ulong)(pVVar2->super_VmValue).users.count;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        pVVar1 = (pVVar2->super_VmValue).users.data[uVar4];
        if (((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
           ((VmBlock *)pVVar1[1].users.data != this)) {
          return true;
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    pVVar2 = pVVar2->nextSibling;
  } while( true );
}

Assistant:

bool VmBlock::HasExternalInstructionUsers()
{
	for(VmInstruction *curr = firstInstruction; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			if(VmInstruction *instUser = getType<VmInstruction>(curr->users[i]))
			{
				if(instUser->parent != this)
					return true;
			}
		}
	}

	return false;
}